

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

char Input::getChar(void)

{
  char cVar1;
  allocator local_69;
  string local_68;
  regex charRegex;
  string local_28;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&charRegex,"[a-z]|[A-Z]",0x10);
  std::__cxx11::string::string((string *)&local_68,"Enter a valid character!",&local_69);
  regexInputValidate(&local_28,&charRegex,&local_68);
  cVar1 = *local_28._M_dataplus._M_p;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&charRegex);
  return cVar1;
}

Assistant:

char Input::getChar() {
    regex charRegex("[a-z]|[A-Z]");
    return regexInputValidate(charRegex, "Enter a valid character!")[0];
}